

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O1

void Io_WriteVerilog(Abc_Ntk_t *pNtk,char *pFileName,int fOnlyAnds)

{
  Abc_NtkType_t AVar1;
  char *pcVar2;
  Abc_Des_t *pAVar3;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    AVar1 = pNtk->ntkType;
  }
  else {
    if (pNtk->ntkFunc != ABC_FUNC_AIG) goto LAB_00346675;
    AVar1 = pNtk->ntkType;
  }
  if (AVar1 == ABC_NTK_NETLIST) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Io_WriteVerilog(): Cannot open the output file \"%s\".\n",pFileName);
      return;
    }
    pcVar2 = pNtk->pName;
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"// Benchmark \"%s\" written by ABC on %s\n",pcVar2,pcVar4);
    fputc(10,__stream);
    pAVar3 = pNtk->pDesign;
    Io_WriteVerilogInt((FILE *)__stream,pNtk,fOnlyAnds);
    if ((pAVar3 != (Abc_Des_t *)0x0) && (pVVar5 = pNtk->pDesign->vModules, 0 < pVVar5->nSize)) {
      lVar6 = 0;
      do {
        pNtk_00 = (Abc_Ntk_t *)pVVar5->pArray[lVar6];
        if (pNtk_00->ntkType != ABC_NTK_NETLIST) {
          __assert_fail("Abc_NtkIsNetlist(pNetlist)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteVerilog.c"
                        ,0x58,"void Io_WriteVerilog(Abc_Ntk_t *, char *, int)");
        }
        if (pNtk_00 != pNtk) {
          fputc(10,__stream);
          Io_WriteVerilogInt((FILE *)__stream,pNtk_00,fOnlyAnds);
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->pDesign->vModules;
      } while (lVar6 < pVVar5->nSize);
    }
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
LAB_00346675:
  puts("Io_WriteVerilog(): Can produce Verilog for mapped or AIG netlists only.");
  return;
}

Assistant:

void Io_WriteVerilog( Abc_Ntk_t * pNtk, char * pFileName, int fOnlyAnds )
{
    Abc_Ntk_t * pNetlist;
    FILE * pFile;
    int i;
    // can only write nodes represented using local AIGs
    if ( !Abc_NtkIsAigNetlist(pNtk) && !Abc_NtkIsMappedNetlist(pNtk) )
    {
        printf( "Io_WriteVerilog(): Can produce Verilog for mapped or AIG netlists only.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteVerilog(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // write the equations for the network
    fprintf( pFile, "// Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    fprintf( pFile, "\n" );

    // write modules
    if ( pNtk->pDesign )
    {
        // write the network first
        Io_WriteVerilogInt( pFile, pNtk, fOnlyAnds );
        // write other things
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNetlist, i )
        {
            assert( Abc_NtkIsNetlist(pNetlist) );
            if ( pNetlist == pNtk )
                continue;
            fprintf( pFile, "\n" );
            Io_WriteVerilogInt( pFile, pNetlist, fOnlyAnds );
        }
    }
    else
    {
        Io_WriteVerilogInt( pFile, pNtk, fOnlyAnds );
    }

    fprintf( pFile, "\n" );
    fclose( pFile );
}